

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::erase(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,key_type *key)

{
  InfoType IVar1;
  uint8_t *puVar2;
  pointer __s1;
  size_t __n;
  long lVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  size_type *psVar7;
  size_t idx;
  
  sVar5 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)this,key);
  IVar1 = this->mInfoInc;
  idx = sVar5 >> 5 & this->mMask;
  uVar6 = (((uint)sVar5 & 0x1f) >> ((byte)this->mInfoHashShift & 0x3f)) + IVar1;
  puVar2 = this->mInfo;
  __s1 = (key->_M_dataplus)._M_p;
  __n = key->_M_string_length;
  psVar7 = &this->mKeyVals[idx].mData.first._M_string_length;
  while (((uVar6 != puVar2[idx] || (__n != *psVar7)) ||
         ((__n != 0 &&
          (iVar4 = bcmp(__s1,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (psVar7 + -1))->_M_dataplus)._M_p,__n), iVar4 != 0))))) {
    uVar6 = uVar6 + IVar1;
    lVar3 = idx + 1;
    idx = idx + 1;
    psVar7 = psVar7 + 5;
    if (puVar2[lVar3] < uVar6) {
      return 0;
    }
  }
  shiftDown(this,idx);
  this->mNumElements = this->mNumElements - 1;
  return 1;
}

Assistant:

size_t erase(const key_type& key) {
        ROBIN_HOOD_TRACE(this)
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        // check while info matches with the source idx
        do {
            if (info == mInfo[idx] && WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                shiftDown(idx);
                --mNumElements;
                return 1;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found to delete
        return 0;
    }